

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

void bov_window_update(bov_window_t *window)

{
  long lVar1;
  double dVar2;
  
  lVar1 = 0xa0;
  if ((window->help_needed != 0) || (lVar1 = 0xb0, window->indication_needed != 0)) {
    bov_text_draw(window,*(bov_text_t **)((long)(window->param).res + lVar1 + -0x10));
  }
  glfwSwapBuffers(window->self);
  if (window->running == 0) {
    glfwWaitEvents();
    glfwSetTime(window->wtime);
  }
  else {
    glfwPollEvents();
    dVar2 = glfwGetTime();
    window->wtime = dVar2;
  }
  (*glad_glBindBuffer)(0x8a11,window->ubo[0]);
  (*glad_glBufferSubData)(0x8a11,0,0x14,&window->param);
  (*glad_glBindBuffer)(0x8a11,0);
  (*glad_glClearColor)
            (window->backgroundColor[0],window->backgroundColor[1],window->backgroundColor[2],
             window->backgroundColor[3]);
  (*glad_glClear)(0x4000);
  return;
}

Assistant:

void bov_window_update(bov_window_t* window)
{
	if(window->help_needed)
		bov_text_draw(window, window->help);
	else if(window->indication_needed)
		bov_text_draw(window, window->indication);

	// Swap front and back buffers
	glfwSwapBuffers(window->self);

	if(window->running) {
		// Poll for and process events
		glfwPollEvents();
		window->wtime = glfwGetTime();
	}
	else {
		glfwWaitEvents();
		glfwSetTime(window->wtime);
	}

	// update the world ubo (we update every frame, even if it isn't changed...)
	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[0]);
	glBufferSubData(GL_UNIFORM_BUFFER, 0, sizeof(bov_world_param_t), &window->param);
	glBindBuffer(GL_UNIFORM_BUFFER, 0);

	glClearColor(window->backgroundColor[0],
	             window->backgroundColor[1],
	             window->backgroundColor[2],
	             window->backgroundColor[3]);
	glClear(GL_COLOR_BUFFER_BIT);
}